

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# naive_vector_column.h
# Opt level: O0

void __thiscall
Gudhi::persistence_matrix::
Naive_vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>
::~Naive_vector_column
          (Naive_vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>
           *this)

{
  bool bVar1;
  reference ppEVar2;
  Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>
  *entry;
  iterator __end0;
  iterator __begin0;
  Column_support *__range2;
  Naive_vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>
  *this_local;
  
  __end0 = std::
           vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
           ::begin(&this->column_);
  entry = (Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>
           *)std::
             vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
             ::end(&this->column_);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_**,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>
                                *)&entry);
    if (!bVar1) break;
    ppEVar2 = __gnu_cxx::
              __normal_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_**,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>
              ::operator*(&__end0);
    _delete_entry(this,*ppEVar2);
    __gnu_cxx::
    __normal_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_**,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>
    ::operator++(&__end0);
  }
  std::
  vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
  ::~vector(&this->column_);
  return;
}

Assistant:

inline Naive_vector_column<Master_matrix,Support>::~Naive_vector_column()
{
  for (auto* entry : column_) {
    _delete_entry(entry);
  }
}